

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O0

void stb_leakcheck_free(void *ptr)

{
  code *pcVar1;
  bool bVar2;
  sx_lock_t sVar3;
  int _i_142;
  stb__leakcheck_malloc_info *mi;
  void *ptr_local;
  
  if (ptr != (void *)0x0) {
    *(ulong *)((long)ptr + -0x18) = *(ulong *)((long)ptr + -0x18) ^ 0xffffffffffffffff;
    sVar3 = mi_lock;
    LOCK();
    mi_lock = 1;
    UNLOCK();
    if (sVar3 != 0) {
      do {
      } while( true );
    }
    bVar2 = false;
    while (!bVar2) {
      if (*(long *)((long)ptr + -8) == 0) {
        if (mi_head != (stb__leakcheck_malloc_info *)((long)ptr + -0xe0)) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/allocator.c"
                            ,0x90,"mi_head == mi");
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        mi_head = *(stb__leakcheck_malloc_info **)((long)ptr + -0x10);
      }
      else {
        *(undefined8 *)(*(long *)((long)ptr + -8) + 0xd0) = *(undefined8 *)((long)ptr + -0x10);
      }
      if (*(long *)((long)ptr + -0x10) != 0) {
        *(undefined8 *)(*(long *)((long)ptr + -0x10) + 0xd8) = *(undefined8 *)((long)ptr + -8);
      }
      mi_lock = 0;
      bVar2 = true;
    }
    free((stb__leakcheck_malloc_info *)((long)ptr + -0xe0));
  }
  return;
}

Assistant:

static void stb_leakcheck_free(void* ptr)
{
    if (ptr != NULL) {
        stb__leakcheck_malloc_info* mi = (stb__leakcheck_malloc_info*)ptr - 1;
        mi->size = ~mi->size;
        sx_lock(mi_lock) {
            if (mi->prev == NULL) {
                sx_assert(mi_head == mi);
                mi_head = mi->next;
            } else
                mi->prev->next = mi->next;
            if (mi->next)
                mi->next->prev = mi->prev;
        }
        free(mi);
    }
}